

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlFindExtraHandler(char *norig,char *name,int output,xmlCharEncConvImpl impl,void *implCtxt,
                       xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandlerPtr pxVar1;
  int iVar2;
  xmlCharEncodingHandler *handler_00;
  char *pcVar3;
  xmlCharEncodingOutputFunc local_60;
  xmlCharEncodingHandler *h;
  int i;
  int ret;
  xmlCharEncodingHandler *handler;
  xmlCharEncodingHandler **out_local;
  void *implCtxt_local;
  xmlCharEncConvImpl impl_local;
  int output_local;
  char *name_local;
  char *norig_local;
  
  handler_00 = (xmlCharEncodingHandler *)(*xmlMalloc)(0x48);
  if (handler_00 == (xmlCharEncodingHandler *)0x0) {
    return 2;
  }
  memset(handler_00,0,0x48);
  pcVar3 = (*xmlMemStrdup)(name);
  handler_00->name = pcVar3;
  if (handler_00->name == (char *)0x0) {
    h._4_4_ = 2;
  }
  else if (impl == (xmlCharEncConvImpl)0x0) {
    if (globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) {
      for (h._0_4_ = 0; (int)h < nbCharEncodingHandler; h._0_4_ = (int)h + 1) {
        pxVar1 = globalHandlers[(int)h];
        iVar2 = xmlStrcasecmp((xmlChar *)name,(xmlChar *)pxVar1->name);
        if (iVar2 == 0) {
          if (output == 0) {
            local_60 = pxVar1->input;
          }
          else {
            local_60 = pxVar1->output;
          }
          if (local_60 != (xmlCharEncodingOutputFunc)0x0) {
            *out = pxVar1;
            h._4_4_ = 0;
            goto LAB_0012f5f0;
          }
        }
      }
    }
    h._4_4_ = xmlInvokeConvImpl(xmlCharEncIconv,handler_00,name,handler_00);
    if (h._4_4_ == 0) {
      *out = handler_00;
      return 0;
    }
    if (h._4_4_ == 0x20) {
      h._4_4_ = 0x20;
    }
  }
  else {
    h._4_4_ = xmlInvokeConvImpl(impl,implCtxt,norig,handler_00);
    if (h._4_4_ == 0) {
      *out = handler_00;
      return 0;
    }
  }
LAB_0012f5f0:
  if (handler_00 != (xmlCharEncodingHandler *)0x0) {
    (*xmlFree)(handler_00->name);
    (*xmlFree)(handler_00);
  }
  return h._4_4_;
}

Assistant:

static int
xmlFindExtraHandler(const char *norig, const char *name, int output,
                    xmlCharEncConvImpl impl, void *implCtxt,
                    xmlCharEncodingHandler **out) {
    xmlCharEncodingHandler *handler;
    int ret;
    int i;

    handler = xmlMalloc(sizeof(*handler));
    if (handler == NULL)
        return(XML_ERR_NO_MEMORY);
    memset(handler, 0, sizeof(*handler));

    handler->name = xmlMemStrdup(name);
    if (handler->name == NULL) {
        ret = XML_ERR_NO_MEMORY;
        goto done;
    }

    /*
     * Try custom implementation before deprecated global handlers.
     *
     * Note that we pass the original name without deprecated
     * alias resolution.
     */
    if (impl != NULL) {
        ret = xmlInvokeConvImpl(impl, implCtxt, norig, handler);
        if (ret != XML_ERR_OK)
            goto done;

        *out = handler;
        return(XML_ERR_OK);
    }

    /*
     * Deprecated
     */
    if (globalHandlers != NULL) {
        for (i = 0; i < nbCharEncodingHandler; i++) {
            xmlCharEncodingHandler *h = globalHandlers[i];

            if (!xmlStrcasecmp((const xmlChar *) name,
                               (const xmlChar *) h->name)) {
                if ((output ? h->output : h->input) != NULL) {
                    *out = h;
                    ret = XML_ERR_OK;
                    goto done;
                }
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    ret = xmlInvokeConvImpl(xmlCharEncIconv, handler, name, handler);
    if (ret == XML_ERR_OK) {
        *out = handler;
        return(XML_ERR_OK);
    }
    if (ret != XML_ERR_UNSUPPORTED_ENCODING)
        goto done;
#endif /* LIBXML_ICONV_ENABLED */

#ifdef LIBXML_ICU_ENABLED
    ret = xmlInvokeConvImpl(xmlCharEncUconv, handler, name, handler);
    if (ret == XML_ERR_OK) {
        *out = handler;
        return(XML_ERR_OK);
    }
    if (ret != XML_ERR_UNSUPPORTED_ENCODING)
        goto done;
#endif /* LIBXML_ICU_ENABLED */

    ret = XML_ERR_UNSUPPORTED_ENCODING;

done:
    if (handler != NULL) {
        xmlFree(handler->name);
        xmlFree(handler);
    }

    return(ret);
}